

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict sexp_gc_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_conflict psVar1;
  undefined8 in_RDI;
  size_t sum_freed;
  undefined8 local_20 [3];
  undefined8 local_8;
  
  local_20[0] = 0;
  local_8 = in_RDI;
  sexp_gc(in_RDI,local_20);
  psVar1 = (sexp_conflict)sexp_make_unsigned_integer(local_8,local_20[0],0);
  return psVar1;
}

Assistant:

sexp sexp_gc_op (sexp ctx, sexp self, sexp_sint_t n) {
  size_t sum_freed=0;
#if SEXP_USE_BOEHM
  GC_gcollect();
#else
  sexp_gc(ctx, &sum_freed);
#endif
  return sexp_make_unsigned_integer(ctx, sum_freed);
}